

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::FunctionBody::MapEntryPoints<Js::FunctionBody::RedeferFunction()::__0>
          (FunctionBody *this,anon_class_8_1_312e1e65 fn)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar1;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  FunctionBody *this_local;
  anon_class_8_1_312e1e65 fn_local;
  
  this_local = (FunctionBody *)fn.threadContext;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizableList__
                      ((WriteBarrierPtr *)&this->entryPoints);
  if (*ppSVar1 !=
      (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    this_00 = Memory::
              WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
              ::operator->(&this->entryPoints);
    SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
    ::
    Map<Js::FunctionBody::MapEntryPoints<Js::FunctionBody::RedeferFunction()::__0>(Js::FunctionBody::RedeferFunction()::__0)const::_lambda(int,Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*)_1_>
              ((SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
                *)this_00,(anon_class_8_1_312e1e65 *)&this_local);
  }
  return;
}

Assistant:

void MapEntryPoints(Fn fn) const
        {
            if (this->entryPoints)
            {
                this->entryPoints->Map([&fn] (int index, RecyclerWeakReference<FunctionEntryPointInfo>* entryPoint) {
                    FunctionEntryPointInfo* strongRef = entryPoint->Get();
                    if (strongRef)
                    {
                        fn(index, strongRef);
                    }
                });
            }
        }